

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::GenerateAccessorDeclarations
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  FieldOptions_CType FVar1;
  CType CVar2;
  Formatter *in_RDI;
  bool unknown_ctype;
  Formatter format;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffffc8;
  Formatter *in_stack_ffffffffffffffd0;
  Options *in_stack_ffffffffffffffe0;
  FieldDescriptor *in_stack_ffffffffffffffe8;
  
  Formatter::Formatter
            (in_RDI,(Printer *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x572dfb);
  FieldDescriptor::options(*(FieldDescriptor **)&(in_RDI->vars_)._M_t._M_impl);
  FVar1 = FieldOptions::ctype((FieldOptions *)0x572e1a);
  CVar2 = EffectiveStringCType(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (FVar1 != CVar2) {
    Formatter::Outdent((Formatter *)0x572e5a);
    Formatter::operator()<>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    Formatter::Indent((Formatter *)0x572e79);
  }
  Formatter::operator()
            ((Formatter *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (char *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (FieldDescriptor **)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  if ((*(byte *)(*(long *)&(in_RDI->vars_)._M_t._M_impl.super__Rb_tree_header._M_header + 0x2c) & 1)
      == 0) {
    Formatter::operator()
              ((Formatter *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (char *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
               (FieldDescriptor **)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  Formatter::operator()
            ((Formatter *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (char *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (FieldDescriptor **)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  if ((*(byte *)(*(long *)&(in_RDI->vars_)._M_t._M_impl.super__Rb_tree_header._M_header + 0x2c) & 1)
      == 0) {
    Formatter::operator()
              ((Formatter *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (char *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
               (FieldDescriptor **)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  Formatter::operator()
            ((Formatter *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (char *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (FieldDescriptor **)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  if (FVar1 != CVar2) {
    Formatter::Outdent((Formatter *)0x572f59);
    Formatter::operator()<>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    Formatter::Indent((Formatter *)0x572f78);
  }
  Formatter::~Formatter((Formatter *)0x572f86);
  return;
}

Assistant:

void RepeatedStringFieldGenerator::GenerateAccessorDeclarations(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  // See comment above about unknown ctypes.
  bool unknown_ctype = descriptor_->options().ctype() !=
                       EffectiveStringCType(descriptor_, options_);

  if (unknown_ctype) {
    format.Outdent();
    format(
        " private:\n"
        "  // Hidden due to unknown ctype option.\n");
    format.Indent();
  }

  format(
      "$deprecated_attr$const std::string& ${1$$name$$}$(int index) const;\n"
      "$deprecated_attr$std::string* ${1$mutable_$name$$}$(int index);\n"
      "$deprecated_attr$void ${1$set_$name$$}$(int index, const "
      "std::string& value);\n"
      "$deprecated_attr$void ${1$set_$name$$}$(int index, std::string&& "
      "value);\n"
      "$deprecated_attr$void ${1$set_$name$$}$(int index, const "
      "char* value);\n",
      descriptor_);
  if (!options_.opensource_runtime) {
    format(
        "$deprecated_attr$void ${1$set_$name$$}$(int index, "
        "StringPiece value);\n",
        descriptor_);
  }
  format(
      "$deprecated_attr$void ${1$set_$name$$}$("
      "int index, const $pointer_type$* value, size_t size);\n"
      "$deprecated_attr$std::string* ${1$add_$name$$}$();\n"
      "$deprecated_attr$void ${1$add_$name$$}$(const std::string& value);\n"
      "$deprecated_attr$void ${1$add_$name$$}$(std::string&& value);\n"
      "$deprecated_attr$void ${1$add_$name$$}$(const char* value);\n",
      descriptor_);
  if (!options_.opensource_runtime) {
    format(
        "$deprecated_attr$void ${1$add_$name$$}$(StringPiece value);\n",
        descriptor_);
  }
  format(
      "$deprecated_attr$void ${1$add_$name$$}$(const $pointer_type$* "
      "value, size_t size)"
      ";\n"
      "$deprecated_attr$const ::$proto_ns$::RepeatedPtrField<std::string>& "
      "${1$$name$$}$() "
      "const;\n"
      "$deprecated_attr$::$proto_ns$::RepeatedPtrField<std::string>* "
      "${1$mutable_$name$$}$()"
      ";\n"
      "private:\n"
      "const std::string& ${1$_internal_$name$$}$(int index) const;\n"
      "std::string* _internal_add_$name$();\n"
      "public:\n",
      descriptor_);

  if (unknown_ctype) {
    format.Outdent();
    format(" public:\n");
    format.Indent();
  }
}